

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawData::ScaleClipRects(ImDrawData *this,ImVec2 *fb_scale)

{
  ImVec4 local_48;
  ImDrawCmd *local_38;
  ImDrawCmd *cmd;
  ImDrawList *pIStack_28;
  int cmd_i;
  ImDrawList *cmd_list;
  ImVec2 *pIStack_18;
  int i;
  ImVec2 *fb_scale_local;
  ImDrawData *this_local;
  
  pIStack_18 = fb_scale;
  fb_scale_local = (ImVec2 *)this;
  for (cmd_list._4_4_ = 0; cmd_list._4_4_ < this->CmdListsCount; cmd_list._4_4_ = cmd_list._4_4_ + 1
      ) {
    pIStack_28 = this->CmdLists[cmd_list._4_4_];
    for (cmd._4_4_ = 0; cmd._4_4_ < (pIStack_28->CmdBuffer).Size; cmd._4_4_ = cmd._4_4_ + 1) {
      local_38 = ImVector<ImDrawCmd>::operator[](&pIStack_28->CmdBuffer,cmd._4_4_);
      ImVec4::ImVec4(&local_48,(local_38->ClipRect).x * pIStack_18->x,
                     (local_38->ClipRect).y * pIStack_18->y,(local_38->ClipRect).z * pIStack_18->x,
                     (local_38->ClipRect).w * pIStack_18->y);
      (local_38->ClipRect).x = local_48.x;
      (local_38->ClipRect).y = local_48.y;
      (local_38->ClipRect).z = local_48.z;
      (local_38->ClipRect).w = local_48.w;
    }
  }
  return;
}

Assistant:

void ImDrawData::ScaleClipRects(const ImVec2& fb_scale)
{
    for (int i = 0; i < CmdListsCount; i++)
    {
        ImDrawList* cmd_list = CmdLists[i];
        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            ImDrawCmd* cmd = &cmd_list->CmdBuffer[cmd_i];
            cmd->ClipRect = ImVec4(cmd->ClipRect.x * fb_scale.x, cmd->ClipRect.y * fb_scale.y, cmd->ClipRect.z * fb_scale.x, cmd->ClipRect.w * fb_scale.y);
        }
    }
}